

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_game.cpp
# Opt level: O3

void __thiscall FCajunMaster::TryAddBot(FCajunMaster *this,BYTE **stream,int player)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BYTE *info;
  botinfo_t *pbVar7;
  botskill_t skill;
  botskill_t skill_00;
  
  iVar2 = ReadByte(stream);
  info = (BYTE *)ReadString(stream);
  iVar3 = ReadByte(stream);
  iVar4 = ReadByte(stream);
  skill_00.perfection = iVar4;
  skill_00.aiming = iVar3;
  iVar5 = ReadByte(stream);
  iVar6 = ReadByte(stream);
  skill_00.isp = iVar6;
  skill_00.reaction = iVar5;
  if (consoleplayer == player) {
    pbVar7 = (botinfo_t *)&this->botinfo;
    iVar2 = iVar2 + 1;
    do {
      pbVar7 = pbVar7->next;
      iVar2 = iVar2 + -1;
    } while (0 < iVar2);
    skill.reaction = iVar5;
    skill.isp = iVar6;
    skill.aiming = iVar3;
    skill.perfection = iVar4;
    bVar1 = DoAddBot((FCajunMaster *)stream,info,skill);
    if (bVar1) {
      this->botnum = this->botnum + 1;
      if (pbVar7 != (botinfo_t *)0x0) {
        pbVar7->inuse = 2;
      }
    }
    else if (pbVar7 != (botinfo_t *)0x0) {
      pbVar7->inuse = 0;
    }
  }
  else {
    bVar1 = DoAddBot((FCajunMaster *)stream,info,skill_00);
    if (bVar1) {
      this->botnum = this->botnum + 1;
    }
  }
  if (info != (BYTE *)0x0) {
    operator_delete__(info);
    return;
  }
  return;
}

Assistant:

void FCajunMaster::TryAddBot (BYTE **stream, int player)
{
	int botshift = ReadByte (stream);
	char *info = ReadString (stream);
	botskill_t skill;
	skill.aiming = ReadByte (stream);
	skill.perfection = ReadByte (stream);
	skill.reaction = ReadByte (stream);
	skill.isp = ReadByte (stream);

	botinfo_t *thebot = NULL;

	if (consoleplayer == player)
	{
		thebot = botinfo;

		while (botshift > 0)
		{
			thebot = thebot->next;
			botshift--;
		}
	}

	if (DoAddBot ((BYTE *)info, skill))
	{
		//Increment this.
		botnum++;

		if (thebot != NULL)
		{
			thebot->inuse = BOTINUSE_Yes;
		}
	}
	else
	{
		if (thebot != NULL)
		{
			thebot->inuse = BOTINUSE_No;
		}
	}

	delete[] info;
}